

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

void __thiscall
CoinSelection_SelectCoins_CoinSelectBnB_with_multiple_asset_Test::TestBody
          (CoinSelection_SelectCoins_CoinSelectBnB_with_multiple_asset_Test *this)

{
  pointer *ppuVar1;
  uint32_t vout;
  pointer pTVar2;
  bool bVar3;
  byte bVar4;
  mapped_type *pmVar5;
  mapped_type_conflict *pmVar6;
  pointer hex;
  _func_int **pp_Var7;
  char *pcVar8;
  CoinSelectionOption *in_R9;
  pointer puVar9;
  pointer utxo;
  pointer puVar10;
  Amount AVar11;
  AssertHelper local_1e8;
  Txid txid;
  AssertionResult gtest_ar_6;
  pointer local_1a8;
  AssertHelper local_1a0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  CoinSelectionOption option;
  Amount local_110;
  Amount fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelection local_60;
  
  cfd::CoinSelection::CoinSelection(&local_60,true);
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option,&exp_dummy_asset_a);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option);
  *pmVar5 = 0x5f5d8cc;
  if ((uint64_t *)option._0_8_ != &option.effective_fee_baserate_) {
    operator_delete((void *)option._0_8_,option.effective_fee_baserate_ + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option,&exp_dummy_asset_b);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option);
  *pmVar5 = 0x14a7184a;
  if ((uint64_t *)option._0_8_ != &option.effective_fee_baserate_) {
    operator_delete((void *)option._0_8_,option.effective_fee_baserate_ + 1);
  }
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_select_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::Amount::Amount(&fee);
  AVar11 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_110.amount_ = AVar11.amount_;
  local_110.ignore_check_ = AVar11.ignore_check_;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetElementsOption();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option,2.0);
  cfd::CoinSelectionOption::SetFeeAsset(&option,&exp_dummy_asset_a);
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectElementsTestVector.
                           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)kExtCoinSelectElementsTestVector.
                           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar2 = kExtCoinSelectElementsTestVector.
           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (kExtCoinSelectElementsTestVector.
      super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      kExtCoinSelectElementsTestVector.
      super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    hex = kExtCoinSelectElementsTestVector.
          super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
          ._M_impl.super__Vector_impl_data._M_start;
    utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid(&txid);
      if ((hex->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)&gtest_ar_6,&hex->txid);
        cfd::core::Txid::operator=(&txid,(Txid *)&gtest_ar_6);
        gtest_ar_6._0_8_ = &PTR__Txid_0086d9f8;
        if (gtest_ar_6.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(gtest_ar_6.message_.ptr_,(long)local_1a8 - (long)gtest_ar_6.message_.ptr_)
          ;
        }
      }
      vout = hex->vout;
      AVar11 = cfd::core::Amount::CreateBySatoshiAmount(hex->amount);
      gtest_ar_6._0_8_ = AVar11.amount_;
      gtest_ar_6.message_.ptr_._0_1_ = AVar11.ignore_check_;
      in_R9 = (CoinSelectionOption *)0x0;
      cfd::CoinSelection::ConvertToUtxo
                (&txid,vout,&hex->descriptor,(Amount *)&gtest_ar_6,&hex->asset,(void *)0x0,utxo,
                 (Script *)0x0);
      txid._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(txid.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      utxo = utxo + 1;
      hex = hex + 1;
    } while (hex != pTVar2);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    pp_Var7 = (_func_int **)0x0;
    puVar9 = (pointer)0x0;
    puVar10 = (pointer)0x0;
    if (bVar3) {
      in_R9 = &option;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid,&local_60,&map_target_amount
                 ,&utxos,&exp_filter,in_R9,&local_110,&map_select_value,&fee,&map_searched_bnb,
                 (AmountMap *)0x0);
      pp_Var7 = txid._vptr_Txid;
      puVar9 = txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar10 = txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    testing::Message::Message((Message *)&txid);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4fa,
               "Expected: ret = coin_select.SelectCoins( map_target_amount, utxos, exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&txid);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (txid._vptr_Txid != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (txid._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*txid._vptr_Txid + 8))();
      }
    }
    pp_Var7 = (_func_int **)0x0;
    puVar9 = (pointer)0x0;
    puVar10 = (pointer)0x0;
  }
  gtest_ar_6._0_8_ = ((long)puVar9 - (long)pp_Var7 >> 3) * -0x7b425ed097b425ed;
  local_1e8.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"ret.size()","4",(unsigned_long *)&gtest_ar_6,(int *)&local_1e8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4fc,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (gtest_ar_6._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_6._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)puVar9 - (long)pp_Var7 == 0x360) {
    gtest_ar_6._0_8_ = &DAT_14a61a62;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[0].amount","static_cast<int64_t>(346430050)",
               (unsigned_long *)(pp_Var7 + 0x10),(long *)&gtest_ar_6);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4fe,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_6._0_8_ != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (gtest_ar_6._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_6._0_8_ = &DAT_000b71b0;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[1].amount","static_cast<int64_t>(750000)",
               (unsigned_long *)(pp_Var7 + 0x2b),(long *)&gtest_ar_6);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4ff,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_6._0_8_ != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (gtest_ar_6._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_6._0_8_ = &DAT_0511f364;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[2].amount","static_cast<int64_t>(85062500)",
               (unsigned_long *)(pp_Var7 + 0x46),(long *)&gtest_ar_6);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x500,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_6._0_8_ != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (gtest_ar_6._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_6._0_8_ = &DAT_00e3f1de;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[3].amount","static_cast<int64_t>(14938590)",
               (unsigned_long *)(pp_Var7 + 0x61),(long *)&gtest_ar_6);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x501,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_6._0_8_ != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (gtest_ar_6._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_6._0_8_ = map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1e8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"map_select_value.size()","2",(unsigned_long *)&gtest_ar_6,
             (int *)&local_1e8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x503,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (gtest_ar_6._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_6._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count == 2) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_a);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&txid);
    local_1e8.data_._0_4_ = 0x5f5e542;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_6,"map_select_value[exp_dummy_asset_a.GetHex()]","100001090",
               pmVar5,(int *)&local_1e8);
    ppuVar1 = &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x505,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (txid._vptr_Txid != (_func_int **)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (txid._vptr_Txid != (_func_int **)0x0)) {
          (**(code **)(*txid._vptr_Txid + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_6.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_b);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&txid);
    local_1e8.data_._0_4_ = 0x14b18c12;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_6,"map_select_value[exp_dummy_asset_b.GetHex()]","347180050",
               pmVar5,(int *)&local_1e8);
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x506,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (txid._vptr_Txid != (_func_int **)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (txid._vptr_Txid != (_func_int **)0x0)) {
          (**(code **)(*txid._vptr_Txid + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_6.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_6._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_1e8.data_._0_4_ = 0x2e0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&txid,"fee.GetSatoshiValue()","736",(long *)&gtest_ar_6,(int *)&local_1e8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x508,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (gtest_ar_6._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_6._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_6._0_8_ = map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1e8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"map_searched_bnb.size()","2",(unsigned_long *)&gtest_ar_6,
             (int *)&local_1e8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x509,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (gtest_ar_6._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar_6._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count == 2) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_a);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&txid);
    gtest_ar_6.success_ = *pmVar6;
    gtest_ar_6.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    ppuVar1 = &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    bVar4 = *pmVar6;
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
      bVar4 = gtest_ar_6.success_;
    }
    if ((bVar4 & 1) == 0) {
      testing::Message::Message((Message *)&local_1e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&txid,(internal *)&gtest_ar_6,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","false","true",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x50b,(char *)txid._vptr_Txid);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if (txid._vptr_Txid != (_func_int **)ppuVar1) {
        operator_delete(txid._vptr_Txid,
                        (ulong)(txid.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1));
      }
      if (CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_6.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_b);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&txid);
    gtest_ar_6._0_8_ = CONCAT71(gtest_ar_6._1_7_,*pmVar6) ^ 1;
    gtest_ar_6.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar4 = *pmVar6 ^ 1;
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
      bVar4 = gtest_ar_6.success_;
    }
    if ((bVar4 & 1) == 0) {
      testing::Message::Message((Message *)&local_1e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&txid,(internal *)&gtest_ar_6,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_b.GetHex()]","true","false",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x50c,(char *)txid._vptr_Txid);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if (txid._vptr_Txid != (_func_int **)ppuVar1) {
        operator_delete(txid._vptr_Txid,
                        (ulong)(txid.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1));
      }
      if (CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_6.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (pp_Var7 != (_func_int **)0x0) {
    operator_delete(pp_Var7,(long)puVar10 - (long)pp_Var7);
  }
  if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  option.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
  if (option.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(option.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)option.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)option.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&map_searched_bnb._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_select_value._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_target_amount._M_t);
  if (local_60.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_60.randomize_cache_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_60.randomize_cache_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_CoinSelectBnB_with_multiple_asset)
{
  CoinSelection coin_select(true);
  // Same condition with "SelectCoins_SelectCoinsBnB"
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 99997900;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 346495050;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetEffectiveFeeBaserate(2);
  option.SetFeeAsset(exp_dummy_asset_a);

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset, nullptr,
        &(*ite));
    ++ite;
  }

  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = coin_select.SelectCoins(
      map_target_amount, utxos, exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 4);
  if (ret.size() == 4) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(346430050));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(750000));
    EXPECT_EQ(ret[2].amount, static_cast<int64_t>(85062500));
    EXPECT_EQ(ret[3].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_EQ(map_select_value.size(), 2);
  if (map_select_value.size() == 2) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 100001090);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 347180050);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 736);
  EXPECT_EQ(map_searched_bnb.size(), 2);
  if (map_searched_bnb.size() == 2) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
  }
}